

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetNavID(ImGuiID id,ImGuiNavLayer nav_layer,ImGuiID focus_scope_id,ImRect *rect_rel)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->NavWindow;
  if (pIVar1 == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindow != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x218e,"void ImGui::SetNavID(ImGuiID, ImGuiNavLayer, ImGuiID, const ImRect &)");
  }
  if (nav_layer < ImGuiNavLayer_COUNT) {
    GImGui->NavId = id;
    pIVar3->NavLayer = nav_layer;
    pIVar3->NavFocusScopeId = focus_scope_id;
    pIVar1->NavLastIds[nav_layer] = id;
    IVar2 = rect_rel->Max;
    pIVar1->NavRectRel[nav_layer].Min = rect_rel->Min;
    (&pIVar1->NavRectRel[nav_layer].Min)[1] = IVar2;
    return;
  }
  __assert_fail("nav_layer == ImGuiNavLayer_Main || nav_layer == ImGuiNavLayer_Menu",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x218f,"void ImGui::SetNavID(ImGuiID, ImGuiNavLayer, ImGuiID, const ImRect &)");
}

Assistant:

void ImGui::SetNavID(ImGuiID id, ImGuiNavLayer nav_layer, ImGuiID focus_scope_id, const ImRect& rect_rel)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow != NULL);
    IM_ASSERT(nav_layer == ImGuiNavLayer_Main || nav_layer == ImGuiNavLayer_Menu);
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = focus_scope_id;
    g.NavWindow->NavLastIds[nav_layer] = id;
    g.NavWindow->NavRectRel[nav_layer] = rect_rel;
    //g.NavDisableHighlight = false;
    //g.NavDisableMouseHover = g.NavMousePosDirty = true;
}